

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

string * __thiscall
DictionaryInstance::op_removeKey
          (string *__return_storage_ptr__,DictionaryInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  undefined8 *puVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::shared_ptr<Instance>,_std::shared_ptr<Instance>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::shared_ptr<Instance>,_std::shared_ptr<Instance>_>_>_>
  pVar2;
  shared_ptr<Instance> key;
  key_type kStack_28;
  
  if ((long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(arguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start == 0x20) {
    get_shared_instance((string *)&kStack_28,&this->_key_type);
    pVar2 = std::
            _Rb_tree<std::shared_ptr<Instance>,_std::pair<const_std::shared_ptr<Instance>,_std::shared_ptr<Instance>_>,_std::_Select1st<std::pair<const_std::shared_ptr<Instance>,_std::shared_ptr<Instance>_>_>,_InstanceIsLessThanComparator,_std::allocator<std::pair<const_std::shared_ptr<Instance>,_std::shared_ptr<Instance>_>_>_>
            ::equal_range(&(this->_value)._M_t,&kStack_28);
    std::
    _Rb_tree<std::shared_ptr<Instance>,_std::pair<const_std::shared_ptr<Instance>,_std::shared_ptr<Instance>_>,_std::_Select1st<std::pair<const_std::shared_ptr<Instance>,_std::shared_ptr<Instance>_>_>,_InstanceIsLessThanComparator,_std::allocator<std::pair<const_std::shared_ptr<Instance>,_std::shared_ptr<Instance>_>_>_>
    ::_M_erase_aux(&(this->_value)._M_t,(_Base_ptr)pVar2.first._M_node,
                   (_Base_ptr)pVar2.second._M_node);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"null","");
    if (kStack_28.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (kStack_28.super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    return __return_storage_ptr__;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "RuntimeError: wrong number of arguments.";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

std::string DictionaryInstance::op_removeKey(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    std::shared_ptr<Instance> key = get_shared_instance(_key_type, arguments[0]);
    _value.erase(key);
    return "null";
}